

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

HeapType __thiscall
wasm::anon_unknown_20::HeapTypeGeneratorImpl::pickSubFunc(HeapTypeGeneratorImpl *this)

{
  bool bVar1;
  HeapType *pHVar2;
  BasicHeapType id;
  optional<wasm::HeapType> oVar3;
  _Storage<wasm::HeapType,_true> local_30;
  optional<wasm::HeapType> type;
  uint32_t choice;
  HeapTypeGeneratorImpl *this_local;
  
  type.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = Random::upTo(this->rand,8);
  if (type.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._12_4_ == 0) {
    HeapType::HeapType((HeapType *)&this_local,func);
  }
  else if (type.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._12_4_ == 1) {
    HeapType::HeapType((HeapType *)&this_local,nofunc);
  }
  else {
    oVar3 = pickKind<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind>(this);
    local_30 = oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
    type.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
         oVar3.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_30._M_value);
    if (bVar1) {
      pHVar2 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_30._M_value);
      this_local = (HeapTypeGeneratorImpl *)pHVar2->id;
    }
    else {
      id = nofunc;
      if ((type.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._12_4_ & 1) != 0) {
        id = func;
      }
      HeapType::HeapType((HeapType *)&this_local,id);
    }
  }
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

HeapType pickSubFunc() {
    auto choice = rand.upTo(8);
    switch (choice) {
      case 0:
        return HeapType::func;
      case 1:
        return HeapType::nofunc;
      default:
        if (auto type = pickKind<SignatureKind>()) {
          return *type;
        }
        return (choice % 2) ? HeapType::func : HeapType::nofunc;
    }
  }